

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManPermuteInputs(Gia_Man_t *p,int nPpis,int nExtra)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  iVar5 = 0;
  while( true ) {
    iVar2 = p->vCis->nSize;
    iVar6 = p->nRegs;
    if ((iVar2 - iVar6) - (nPpis + nExtra) <= iVar5) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4 = Gia_ManCi(p,iVar5);
    pGVar4->Value = uVar1;
    iVar5 = iVar5 + 1;
  }
  for (iVar5 = (iVar2 - iVar6) - nExtra; iVar5 < iVar2 - iVar6; iVar5 = iVar5 + 1) {
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4 = Gia_ManCi(p,iVar5);
    pGVar4->Value = uVar1;
    iVar2 = p->vCis->nSize;
    iVar6 = p->nRegs;
  }
  for (iVar5 = (iVar2 - iVar6) - (nPpis + nExtra); iVar6 = iVar2 - iVar6, iVar5 < iVar6 - nExtra;
      iVar5 = iVar5 + 1) {
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4 = Gia_ManCi(p,iVar5);
    pGVar4->Value = uVar1;
    iVar2 = p->vCis->nSize;
    iVar6 = p->nRegs;
  }
  for (; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4 = Gia_ManCi(p,iVar6);
    pGVar4->Value = uVar1;
    iVar2 = p->vCis->nSize;
  }
  if (p_00->vCis->nSize != iVar2) {
    __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x9bf,"Gia_Man_t *Gia_ManPermuteInputs(Gia_Man_t *, int, int)");
  }
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManObj(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iVar6 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManAppendAnd(p_00,iVar2,iVar6);
      pGVar4->Value = uVar1;
    }
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    uVar1 = Gia_ManAppendCo(p_00,iVar2);
    pGVar4->Value = uVar1;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManPermuteInputs( Gia_Man_t * p, int nPpis, int nExtra )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < Gia_ManPiNum(p) - nPpis - nExtra; i++ ) // regular PIs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nExtra; i < Gia_ManPiNum(p); i++ ) // extra PIs due to DC values
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nPpis - nExtra; i < Gia_ManPiNum(p) - nExtra; i++ ) // pseudo-PIs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p); i < Gia_ManCiNum(p); i++ ) // flop outputs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}